

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

void __thiscall
Imf_2_5::
TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
TypedAttribute(TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  Attribute::Attribute(&this->super_Attribute);
  (this->super_Attribute)._vptr_Attribute = (_func_int **)&PTR__TypedAttribute_03011fe0;
  std::__cxx11::string::string((string *)&this->_value,(string *)value);
  return;
}

Assistant:

TypedAttribute<T>::TypedAttribute (const T & value):
    Attribute (),
    _value (value)
{
    // empty
}